

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TexCubeShader::TexCubeShader(TexCubeShader *this,CubeFace face)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderProgramDeclaration *pSVar2;
  long *plVar3;
  long *plVar4;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  long *local_288;
  long local_280;
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258 [2];
  VertexSource local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  FragmentOutput local_204;
  Uniform local_200;
  VertexAttribute local_1d8;
  VertexAttribute local_1b0;
  long *local_188 [2];
  long local_178 [2];
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"a_position","");
  local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_268,local_260 + (long)local_268);
  local_1b0.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_1b0);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"a_coord","");
  local_1d8.name._M_dataplus._M_p = (pointer)&local_1d8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_288,local_280 + (long)local_288);
  local_1d8.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1d8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_148);
  local_204.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_204);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"u_sampler0","");
  local_200.name._M_dataplus._M_p = (pointer)&local_200.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_2a8,local_2a0 + (long)local_2a8);
  local_200.type = TYPE_SAMPLER_CUBE;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_200);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_248.source._M_dataplus._M_p = (pointer)&local_248.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_2c8,local_2c0 + (long)local_2c8);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_248);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_188);
  local_308 = &local_2f8;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_2f8 = *plVar4;
    lStack_2f0 = plVar3[3];
  }
  else {
    local_2f8 = *plVar4;
    local_308 = (long *)*plVar3;
  }
  local_300 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_308);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_218 = *plVar4;
    lStack_210 = plVar3[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar4;
    local_228 = (long *)*plVar3;
  }
  local_220 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_2d8 = *plVar4;
    uStack_2d0 = (undefined4)plVar3[3];
    uStack_2cc = *(undefined4 *)((long)plVar3 + 0x1c);
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *plVar4;
    local_2e8 = (long *)*plVar3;
  }
  local_2e0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_2e8,local_2e0 + (long)local_2e8);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.source._M_dataplus._M_p != &local_248.source.field_2) {
    operator_delete(local_248.source._M_dataplus._M_p,
                    local_248.source.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.name._M_dataplus._M_p != &local_200.name.field_2) {
    operator_delete(local_200.name._M_dataplus._M_p,local_200.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
    operator_delete(local_1b0.name._M_dataplus._M_p,local_1b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0078d2f0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0078d328;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0078d340;
  *(CubeFace *)&(this->super_ShaderProgram).field_0x154 = face;
  return;
}

Assistant:

TexCubeShader (tcu::CubeFace face)
		: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::Uniform("u_sampler0", glu::TYPE_SAMPLER_CUBE)
					<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
												"attribute mediump vec2 a_coord;\n"
												"varying mediump vec2 v_coord;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_coord = a_coord;\n"
												"}\n")
					<< sglr::pdec::FragmentSource(string("") +
												  "uniform samplerCube u_sampler0;\n"
												  "varying mediump vec2 v_coord;\n"
												  "void main (void)\n"
												  "{\n"
												  "	mediump float x = v_coord.x*2.0 - 1.0;\n"
												  "	mediump float y = v_coord.y*2.0 - 1.0;\n"
												  "	gl_FragColor = textureCube(u_sampler0, " + s_cubeSwizzles[face] + ");\n"
												  "}\n"))
		, m_face(face)
	{
	}